

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::FunctionBody(FunctionBody *this,ParseableFunctionInfo *proxy)

{
  Type *addr;
  undefined1 *puVar1;
  Type pSVar2;
  Utf8SourceInfo *pUVar3;
  ThreadContext *pTVar4;
  code *pcVar5;
  bool bVar6;
  Recycler *pRVar7;
  FunctionEntryPointInfo *pFVar8;
  undefined4 *puVar9;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar10;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  ParseableFunctionInfo::ParseableFunctionInfo(&this->super_ParseableFunctionInfo,proxy);
  (this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014da518;
  (this->counters).fieldSize = '\0';
  puVar1 = &(this->counters).field_0x1;
  *puVar1 = *puVar1 & 0xfc;
  (this->counters).fields.ptr = (Fields *)0x0;
  CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::AllocCounters<unsigned_char>
            (&this->counters,this);
  this->regAllocStoreCount = 0;
  this->regAllocLoadCount = 0;
  this->callCountStats = 0;
  (this->m_sourceInfo).m_auxStatementData.ptr = (AuxStatementData *)0x0;
  (this->m_sourceInfo).pSpanSequence = (Type)0x0;
  (this->m_sourceInfo).frameDisplayRegister = 0;
  (this->m_sourceInfo).objectRegister = 0;
  (this->m_sourceInfo).pScopeObjectChain.ptr = (ScopeObjectChain *)0x0;
  (this->m_sourceInfo).m_probeBackingBlock.ptr = (ByteBlock *)0x0;
  (this->m_sourceInfo).m_probeCount = 0;
  (this->byteCodeBlock).ptr = (ByteBlock *)0x0;
  (this->entryPoints).ptr =
       (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
        *)0x0;
  (this->m_constTable).ptr = (WriteBarrierPtr<void> *)0x0;
  (this->inlineCaches).ptr = (void **)0x0;
  *(undefined8 *)((long)&(this->inlineCaches).ptr + 4) = 0;
  *(undefined8 *)((long)&(this->polymorphicInlineCaches).inlineCaches.ptr + 4) = 0;
  (this->cacheIdToPropertyIdMap).ptr = (int *)0x0;
  (this->m_inlineCacheTypes).ptr = (uchar *)0x0;
  *(undefined8 *)((long)&(this->m_inlineCacheTypes).ptr + 5) = 0;
  this->m_uScriptId =
       ((((((proxy->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo).
       ptr)->sourceContextId;
  this->m_iProfileSession = -1;
  this->m_envDepth = 0xffff;
  this->m_argUsedForBranch = 0;
  this->profiledLdLenCount = 0;
  this->profiledLdElemCount = 0;
  this->profiledStElemCount = 0;
  this->profiledCallSiteCount = 0;
  this->profiledArrayCallSiteCount = 0;
  this->profiledDivOrRemCount = 0;
  this->profiledSwitchCount = 0;
  this->profiledReturnTypeCount = 0;
  this->profiledSlotCount = 0;
  this->m_tag31 = true;
  this->m_hasFinally = false;
  this->hasScopeObject = false;
  this->hasCachedScopePropIds = false;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0x3820 | 0x4040001;
  *(ushort *)&this->field_0x17c = ((ushort)*(undefined4 *)&this->field_0x17c & 0xe400) + 1;
  this->bailOnMisingProfileCount = '\0';
  this->bailOnMisingProfileRejitCount = '\0';
  this->inlineDepth = '\0';
  FunctionExecutionStateMachine::FunctionExecutionStateMachine(&this->executionState);
  this->m_depth = 0;
  this->loopInterpreterLimit = DAT_015a1ee8;
  this->m_asmJsTotalLoopCount = 0;
  this->debuggerScopeIndex = 0;
  this->savedPolymorphicCacheState = 0;
  this->byteCodeCache = (Type)0x0;
  (this->defaultFunctionEntryPointInfo).ptr = (FunctionEntryPointInfo *)0x0;
  (this->dynamicProfileInfo).ptr = (DynamicProfileInfo *)0x0;
  this->savedInlinerVersion = '\0';
  this->savedImplicitCallsFlags = ImplicitCall_HasNoInfo;
  pSVar2 = (proxy->super_FunctionProxy).m_scriptContext;
  SetCountField(this,ConstantCount,1);
  FunctionProxy::UpdateFunctionBodyImpl(&proxy->super_FunctionProxy,this);
  local_58 = (undefined1  [8])&FunctionEntryPointInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab02c8;
  data.filename._0_4_ = 0x2fe;
  pRVar7 = Memory::Recycler::TrackAllocInfo(pSVar2->recycler,(TrackAllocData *)local_58);
  pFVar8 = (FunctionEntryPointInfo *)new<Memory::Recycler>(0x88,pRVar7,0x39e810);
  FunctionEntryPointInfo::FunctionEntryPointInfo
            (pFVar8,(FunctionProxy *)this,pSVar2->CurrentThunk,pSVar2->threadContext);
  addr = &(this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr =
       (ProxyEntryPointInfo *)pFVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  SetDefaultFunctionEntryPointInfo
            (this,(FunctionEntryPointInfo *)
                  (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.
                  ptr,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  puVar1 = &(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
  *puVar1 = *puVar1 | 2;
  pUVar3 = (proxy->super_FunctionProxy).m_utf8SourceInfo.ptr;
  if ((pUVar3 != (Utf8SourceInfo *)0x0) &&
     (this->m_uScriptId != ((((pUVar3->m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x303,
                                "(!proxy->GetUtf8SourceInfo() || m_uScriptId == proxy->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId)"
                                ,
                                "!proxy->GetUtf8SourceInfo() || m_uScriptId == proxy->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId"
                               );
    if (!bVar6) goto LAB_0075b781;
    *puVar9 = 0;
  }
  pTVar4 = pSVar2->threadContext;
  local_58 = (undefined1  [8])
             &SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab02c8;
  data.filename._0_4_ = 0x307;
  pRVar7 = Memory::Recycler::TrackAllocInfo(pSVar2->recycler,(TrackAllocData *)local_58);
  pSVar10 = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
             *)new<Memory::Recycler>(0x38,pRVar7,0x387914);
  (pSVar10->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).
  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
  .alloc = pSVar2->recycler;
  (pSVar10->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).
  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
  .buffer.ptr = (WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_> *)0x0;
  (pSVar10->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).
  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
  .count = 0;
  (pSVar10->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).length = 0;
  (pSVar10->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).increment = 4;
  (pSVar10->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).
  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
  ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014db0d8;
  pSVar10->syncObj = &pTVar4->csFunctionBody;
  Memory::Recycler::WBSetBit((char *)&this->entryPoints);
  (this->entryPoints).ptr = pSVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entryPoints);
  pFVar8 = GetDefaultFunctionEntryPointInfo(this);
  AddEntryPointToEntryPointList(this,pFVar8);
  if (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr)->
      jsMethod == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x30b,"(this->GetDefaultEntryPointInfo()->jsMethod != nullptr)",
                                "this->GetDefaultEntryPointInfo()->jsMethod != nullptr");
    if (!bVar6) {
LAB_0075b781:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar9 = 0;
  }
  InitDisableInlineApply(this);
  InitDisableInlineSpread(this);
  return;
}

Assistant:

FunctionBody::FunctionBody(ParseableFunctionInfo * proxy) :
        ParseableFunctionInfo(proxy),
        counters(this),
        m_uScriptId(proxy->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId),
        cleanedUp(false),
        sourceInfoCleanedUp(false),
        profiledLdLenCount(0),
        profiledLdElemCount(0),
        profiledStElemCount(0),
        profiledCallSiteCount(0),
        profiledArrayCallSiteCount(0),
        profiledDivOrRemCount(0),
        profiledSwitchCount(0),
        profiledReturnTypeCount(0),
        profiledSlotCount(0),
        m_isFuncRegistered(false),
        m_isFuncRegisteredToDiag(false),
        m_hasBailoutInstrInJittedCode(false),
        m_depth(0),
        inlineDepth(0),
        m_pendingLoopHeaderRelease(false),
        hasCachedScopePropIds(false),
        m_argUsedForBranch(0),
        m_envDepth((uint16)-1),
        loopInterpreterLimit(CONFIG_FLAG(LoopInterpretCount)),
        savedPolymorphicCacheState(0),
        debuggerScopeIndex(0),
        m_hasFinally(false),
#if ENABLE_PROFILE_INFO
        dynamicProfileInfo(nullptr),
#endif
        savedInlinerVersion(0),
#if ENABLE_NATIVE_CODEGEN
        savedImplicitCallsFlags(ImplicitCall_HasNoInfo),
#endif
        hasExecutionDynamicProfileInfo(false),
        m_hasAllNonLocalReferenced(false),
        m_hasSetIsObject(false),
        m_hasFunExprNameReference(false),
        m_CallsEval(false),
        m_ChildCallsEval(false),
        m_hasReferenceableBuiltInArguments(false),
        m_isParamAndBodyScopeMerged(true),
        m_firstFunctionObject(true),
        m_inlineCachesOnFunctionObject(false),
        m_hasDoneAllNonLocalReferenced(false),
        m_hasFunctionCompiledSent(false),
        byteCodeCache(nullptr),
        m_hasLocalClosureRegister(false),
        m_hasParamClosureRegister(false),
        m_hasLocalFrameDisplayRegister(false),
        m_hasEnvRegister(false),
        m_hasThisRegisterForEventHandler(false),
        m_hasFirstInnerScopeRegister(false),
        m_hasFuncExprScopeRegister(false),
        m_hasFirstTmpRegister(false),
        m_hasActiveReference(false),
        m_tag31(true),
        m_tag32(true),
        m_tag33(true),
        m_nativeEntryPointUsed(false),
        hasDoneLoopBodyCodeGen(false),
        bailOnMisingProfileCount(0),
        bailOnMisingProfileRejitCount(0),
        byteCodeBlock(nullptr),
        entryPoints(nullptr),
        m_constTable(nullptr),
        inlineCaches(nullptr),
        cacheIdToPropertyIdMap(nullptr),
        wasCalledFromLoop(false),
        hasScopeObject(false),
        hasNestedLoop(false),
        recentlyBailedOutOfJittedLoopBody(false),
        m_isAsmJsScheduledForFullJIT(false),
        m_asmJsTotalLoopCount(0)
        //
        // Even if the function does not require any locals, we must always have "R0" to propagate
        // a return value.  By enabling this here, we avoid unnecessary conditionals during execution.
        //
#ifdef IR_VIEWER
        ,m_isIRDumpEnabled(false)
        ,m_irDumpBaseObject(nullptr)
#endif /* IR_VIEWER */
        , m_isFromNativeCodeModule(false)
        , hasHotLoop(false)
        , m_isPartialDeserializedFunction(false)
#if DBG
        , m_isSerialized(false)
#endif
#ifdef PERF_COUNTERS
        , m_isDeserializedFunction(false)
#endif
#if DBG
        , m_DEBUG_executionCount(0)
        , m_nativeEntryPointIsInterpreterThunk(false)
        , m_canDoStackNestedFunc(false)
        , m_inlineCacheTypes(nullptr)
        , m_iProfileSession(-1)
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
        , regAllocLoadCount(0)
        , regAllocStoreCount(0)
        , callCountStats(0)
#endif
    {
        ScriptContext * scriptContext = proxy->GetScriptContext();

        SetCountField(CounterFields::ConstantCount, 1);

        proxy->UpdateFunctionBodyImpl(this);

        this->m_defaultEntryPointInfo = RecyclerNewFinalized(scriptContext->GetRecycler(),
            FunctionEntryPointInfo, this, scriptContext->CurrentThunk, scriptContext->GetThreadContext());

        this->SetDefaultFunctionEntryPointInfo((FunctionEntryPointInfo*) this->GetDefaultEntryPointInfo(), DefaultEntryThunk);
        this->m_hasBeenParsed = true;

        Assert(!proxy->GetUtf8SourceInfo() || m_uScriptId == proxy->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId);

        // Sync entryPoints changes to etw rundown lock
        CriticalSection* syncObj = scriptContext->GetThreadContext()->GetFunctionBodyLock();
        this->entryPoints = RecyclerNew(scriptContext->GetRecycler(), FunctionEntryPointList, scriptContext->GetRecycler(), syncObj);

        this->AddEntryPointToEntryPointList(this->GetDefaultFunctionEntryPointInfo());

        Assert(this->GetDefaultEntryPointInfo()->jsMethod != nullptr);

        InitDisableInlineApply();
        InitDisableInlineSpread();
    }